

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Any.H
# Opt level: O3

void __thiscall amrex::Any::operator=(Any *this,MultiFab *mf)

{
  _Head_base<0UL,_amrex::Any::innards_base_*,_false> _Var1;
  _Head_base<0UL,_amrex::Any::innards_base_*,_false> _Var2;
  
  _Var2._M_head_impl = (innards_base *)operator_new(0x188);
  (_Var2._M_head_impl)->_vptr_innards_base = (_func_int **)&PTR_Type_0080e380;
  MultiFab::MultiFab((MultiFab *)(_Var2._M_head_impl + 1),mf);
  _Var1._M_head_impl =
       (this->m_ptr)._M_t.
       super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
       ._M_t.
       super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
       .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl;
  (this->m_ptr)._M_t.
  super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>.
  _M_t.
  super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
  .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (innards_base *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_innards_base[2])();
    return;
  }
  return;
}

Assistant:

void operator= (MF && mf) {
        m_ptr = std::make_unique<innards<MF> >(std::forward<MF>(mf));
    }